

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O1

void duckdb::RegularLikeFunction<duckdb::LikeOperator,false>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  idx_t count;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  BoundFunctionExpression *pBVar9;
  LikeMatcher *this_00;
  reference pvVar10;
  reference right;
  TemplatedValidityData<unsigned_long> *pTVar11;
  idx_t iVar12;
  ulong uVar13;
  unsigned_long uVar14;
  ulong uVar15;
  idx_t idx_in_entry;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  idx_t iVar19;
  data_ptr_t pdVar20;
  anon_union_16_2_67f50693_for_value local_b8;
  data_ptr_t local_a0;
  ulong local_98;
  data_ptr_t local_90;
  reference local_88;
  idx_t local_80;
  anon_union_16_2_67f50693_for_value local_78;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pBVar9 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  if ((pBVar9->bind_info).
      super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
      super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
      super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl == (FunctionData *)0x0) {
    pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
    right = vector<duckdb::Vector,_true>::operator[](&input->data,1);
    BinaryExecutor::
    ExecuteSwitch<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::LikeOperator,bool>
              (pvVar10,right,result,input->count,false);
    return;
  }
  this_00 = (LikeMatcher *)
            unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar9->bind_info);
  pvVar10 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  count = input->count;
  if (pvVar10->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    local_a0 = result->data;
    pdVar20 = pvVar10->data;
    FlatVector::VerifyFlatVector(pvVar10);
    FlatVector::VerifyFlatVector(result);
    puVar3 = (pvVar10->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar3 == (unsigned_long *)0x0) {
      if (count != 0) {
        pdVar20 = pdVar20 + 8;
        iVar19 = 0;
        do {
          local_78._0_8_ = *(undefined8 *)(pdVar20 + -8);
          local_78.pointer.ptr = (char *)*(undefined8 *)pdVar20;
          bVar8 = LikeMatcher::Match(this_00,(string_t *)&local_78.pointer);
          local_a0[iVar19] = bVar8;
          iVar19 = iVar19 + 1;
          pdVar20 = pdVar20 + 0x10;
        } while (count != iVar19);
      }
    }
    else {
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar3;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(pvVar10->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (pvVar10->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if (0x3f < count + 0x3f) {
        local_98 = count + 0x3f >> 6;
        local_90 = pdVar20 + 8;
        uVar18 = 0;
        uVar17 = 0;
        local_88 = pvVar10;
        do {
          puVar3 = (local_88->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar14 = 0xffffffffffffffff;
          }
          else {
            uVar14 = puVar3[uVar18];
          }
          uVar13 = uVar17 + 0x40;
          if (count <= uVar17 + 0x40) {
            uVar13 = count;
          }
          uVar15 = uVar13;
          if (uVar14 != 0) {
            uVar15 = uVar17;
            if (uVar14 == 0xffffffffffffffff) {
              if (uVar17 < uVar13) {
                pdVar20 = local_90 + uVar17 * 0x10;
                do {
                  local_78._0_8_ = *(undefined8 *)(pdVar20 + -8);
                  local_78.pointer.ptr = (char *)*(undefined8 *)pdVar20;
                  bVar8 = LikeMatcher::Match(this_00,(string_t *)&local_78.pointer);
                  local_a0[uVar15] = bVar8;
                  uVar15 = uVar15 + 1;
                  pdVar20 = pdVar20 + 0x10;
                } while (uVar13 != uVar15);
              }
            }
            else if (uVar17 < uVar13) {
              pdVar20 = local_90 + uVar17 * 0x10;
              uVar16 = 0;
              do {
                if ((uVar14 >> (uVar16 & 0x3f) & 1) != 0) {
                  local_78._0_8_ = *(undefined8 *)(pdVar20 + -8);
                  local_78.pointer.ptr = (char *)*(undefined8 *)pdVar20;
                  bVar8 = LikeMatcher::Match(this_00,(string_t *)&local_78.pointer);
                  local_a0[uVar17] = bVar8;
                }
                uVar17 = uVar17 + 1;
                pdVar20 = pdVar20 + 0x10;
                uVar16 = uVar16 + 1;
                uVar15 = uVar17;
              } while (uVar13 != uVar17);
            }
          }
          uVar18 = uVar18 + 1;
          uVar17 = uVar15;
        } while (uVar18 != local_98);
      }
    }
  }
  else if (pvVar10->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    pdVar20 = result->data;
    pdVar2 = pvVar10->data;
    puVar3 = (pvVar10->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    local_78._0_8_ = *(undefined8 *)pdVar2;
    local_78.pointer.ptr = (char *)*(undefined8 *)(pdVar2 + 8);
    bVar8 = LikeMatcher::Match(this_00,(string_t *)&local_78.pointer);
    *pdVar20 = bVar8;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78.pointer);
    Vector::ToUnifiedFormat(pvVar10,count,(UnifiedVectorFormat *)&local_78.pointer);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar20 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_68 == 0) {
      if (count != 0) {
        lVar4 = *(long *)local_78._0_8_;
        iVar19 = 0;
        do {
          iVar12 = iVar19;
          if (lVar4 != 0) {
            iVar12 = (idx_t)*(uint *)(lVar4 + iVar19 * 4);
          }
          local_b8._0_8_ = *(undefined8 *)(local_78.pointer.ptr + iVar12 * 0x10);
          local_b8.pointer.ptr = (char *)*(undefined8 *)(local_78.pointer.ptr + iVar12 * 0x10 + 8);
          bVar8 = LikeMatcher::Match(this_00,(string_t *)&local_b8.pointer);
          pdVar20[iVar19] = bVar8;
          iVar19 = iVar19 + 1;
        } while (count != iVar19);
      }
    }
    else if (count != 0) {
      lVar4 = *(long *)local_78._0_8_;
      uVar17 = 0;
      do {
        uVar18 = uVar17;
        if (lVar4 != 0) {
          uVar18 = (ulong)*(uint *)(lVar4 + uVar17 * 4);
        }
        if ((*(ulong *)(local_68 + (uVar18 >> 6) * 8) >> (uVar18 & 0x3f) & 1) == 0) {
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_b8.pointer,&local_80);
            uVar7 = local_b8.pointer.ptr;
            uVar6 = local_b8._0_8_;
            local_b8._0_8_ = (element_type *)0x0;
            local_b8.pointer.ptr = (char *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)uVar6;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.pointer.ptr !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.pointer.ptr);
            }
            pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar11->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar5 = (byte)uVar17 & 0x3f;
          puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                   (uVar17 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        }
        else {
          local_b8._0_8_ = *(undefined8 *)(local_78.pointer.ptr + uVar18 * 0x10);
          local_b8.pointer.ptr = (char *)*(undefined8 *)(local_78.pointer.ptr + uVar18 * 0x10 + 8);
          bVar8 = LikeMatcher::Match(this_00,(string_t *)&local_b8.pointer);
          pdVar20[uVar17] = bVar8;
        }
        uVar17 = uVar17 + 1;
      } while (count != uVar17);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void RegularLikeFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	if (func_expr.bind_info) {
		auto &matcher = func_expr.bind_info->Cast<LikeMatcher>();
		// use fast like matcher
		UnaryExecutor::Execute<string_t, bool>(input.data[0], result, input.size(), [&](string_t input) {
			return INVERT ? !matcher.Match(input) : matcher.Match(input);
		});
	} else {
		// use generic like matcher
		BinaryExecutor::ExecuteStandard<string_t, string_t, bool, OP>(input.data[0], input.data[1], result,
		                                                              input.size());
	}
}